

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

UBool __thiscall icu_63::Formattable::isNumeric(Formattable *this)

{
  UBool UVar1;
  
  UVar1 = (UBool)(0x10000010100 >> ((char)this->fType * '\b' & 0x3fU));
  if (kInt64 < this->fType) {
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
Formattable::isNumeric() const {
    switch (fType) {
    case kDouble:
    case kLong:
    case kInt64:
        return TRUE;
    default:
        return FALSE;
    }
}